

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void modwt(wt_object wt,double *inp)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  wave_object pwVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  void *__ptr;
  double *pdVar10;
  long lVar11;
  fft_object obj;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup;
  fft_data *inp_01;
  fft_data *oup_00;
  fft_data *oup_01;
  void *pvVar12;
  fft_data *pfVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  char *__s;
  int iVar22;
  long lVar23;
  size_t sVar24;
  uint uVar25;
  int iVar26;
  double dVar27;
  double dVar28;
  int local_40;
  
  iVar7 = strcmp(wt->cmethod,"direct");
  if (iVar7 == 0) {
    iVar7 = strcmp(wt->ext,"per");
    if (iVar7 == 0) {
      iVar8 = 1;
      uVar5 = wt->siglength;
      iVar7 = wt->J;
      lVar23 = (long)iVar7;
      wt->length[lVar23] = uVar5;
      wt->length[0] = uVar5;
      iVar15 = (iVar7 + 1) * uVar5;
      wt->length[lVar23 + 1] = iVar15;
      wt->outlength = iVar15;
      for (lVar9 = 0x17; lVar9 + -0x16 < lVar23; lVar9 = lVar9 + 1) {
        *(uint *)(wt->method + lVar9 * 4 + -0x10) = uVar5;
      }
      sVar24 = (long)(int)uVar5 * 8;
      pvVar12 = malloc(sVar24);
      __ptr = malloc(sVar24);
      uVar19 = 0;
      uVar20 = 0;
      if (0 < (int)uVar5) {
        uVar20 = (ulong)uVar5;
      }
      for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
        *(double *)(wt[1].method + uVar19 * 8 + -0x10) = inp[uVar19];
      }
      uVar25 = uVar5 + (uVar5 == 0);
      iVar16 = 0;
      if (iVar7 < 1) {
        iVar7 = iVar16;
      }
      for (; iVar16 != iVar7; iVar16 = iVar16 + 1) {
        lVar9 = (long)iVar15;
        pwVar6 = wt->wave;
        uVar21 = pwVar6->lpd_len;
        lVar23 = (long)(int)uVar21;
        pdVar10 = (double *)malloc(lVar23 << 4);
        uVar19 = 0;
        if (0 < (int)uVar21) {
          uVar19 = (ulong)uVar21;
        }
        pdVar1 = pdVar10 + lVar23;
        for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
          pdVar10[uVar17] = pwVar6->lpd[uVar17] / 1.4142135623730951;
          pdVar1[uVar17] = pwVar6->hpd[uVar17] / 1.4142135623730951;
        }
        iVar8 = iVar8 << (iVar16 != 0);
        for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
          dVar28 = *pdVar10 * *(double *)(wt[1].method + uVar19 * 8 + -0x10);
          dVar27 = *(double *)(wt[1].method + uVar19 * 8 + -0x10) * *pdVar1;
          *(double *)((long)pvVar12 + uVar19 * 8) = dVar28;
          *(double *)((long)__ptr + uVar19 * 8) = dVar27;
          iVar22 = (int)uVar19;
          for (lVar11 = 1; lVar11 < lVar23; lVar11 = lVar11 + 1) {
            iVar26 = (uVar5 - iVar8) + iVar22;
            iVar22 = (iVar8 - uVar5) - iVar22;
            do {
              iVar26 = iVar26 - uVar5;
              iVar22 = iVar22 + uVar5;
            } while ((int)uVar5 <= iVar26);
            iVar14 = 0;
            if (0 < iVar26) {
              iVar14 = iVar26;
            }
            uVar21 = (uint)(iVar14 != iVar26);
            iVar22 = (((iVar14 - uVar21) + iVar22) / uVar25 + uVar21) * uVar5 + iVar26;
            dVar2 = *(double *)
                     (wt[1].method +
                     (ulong)((((iVar14 - uVar21) - iVar26) / uVar25 + uVar21) * uVar5 + iVar26) * 8
                     + -0x10);
            dVar28 = dVar28 + pdVar10[lVar11] * dVar2;
            dVar3 = pdVar1[lVar11];
            *(double *)((long)pvVar12 + uVar19 * 8) = dVar28;
            dVar27 = dVar27 + dVar2 * dVar3;
            *(double *)((long)__ptr + uVar19 * 8) = dVar27;
          }
        }
        iVar15 = iVar15 - uVar5;
        free(pdVar10);
        for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
          *(undefined8 *)(wt[1].method + uVar19 * 8 + -0x10) =
               *(undefined8 *)((long)pvVar12 + uVar19 * 8);
          *(undefined8 *)((long)wt + uVar19 * 8 + lVar9 * 8 + (long)(int)uVar5 * -8 + 0x1f8) =
               *(undefined8 *)((long)__ptr + uVar19 * 8);
        }
      }
      free(pvVar12);
      free(__ptr);
      return;
    }
    puts("MODWT direct method only uses periodic extension per. ");
    __s = " Use MODWT fft method for symmetric extension sym ";
  }
  else {
    iVar7 = strcmp(wt->cmethod,"fft");
    if (iVar7 == 0) {
      uVar5 = wt->siglength;
      lVar23 = (long)(int)uVar5;
      uVar25 = wt->wave->lpd_len;
      lVar9 = (long)(int)uVar25;
      iVar7 = strcmp(wt->ext,"sym");
      if (iVar7 == 0) {
        uVar21 = uVar5 * 2;
      }
      else {
        strcmp(wt->ext,"per");
        uVar21 = uVar5;
      }
      iVar7 = wt->J;
      lVar18 = (long)iVar7;
      wt->modwtsiglength = uVar21;
      wt->length[lVar18] = uVar21;
      wt->length[0] = uVar21;
      iVar15 = (iVar7 + 1) * uVar21;
      wt->length[lVar18 + 1] = iVar15;
      wt->outlength = iVar15;
      for (lVar11 = 0x17; lVar11 + -0x16 < lVar18; lVar11 = lVar11 + 1) {
        *(uint *)(wt->method + lVar11 * 4 + -0x10) = uVar21;
      }
      obj = fft_init(uVar21,1);
      obj_00 = fft_init(uVar21,-1);
      lVar18 = (long)(int)uVar21;
      sVar24 = lVar18 << 4;
      inp_00 = (fft_data *)malloc(sVar24);
      oup = (fft_data *)malloc(sVar24);
      inp_01 = (fft_data *)malloc(sVar24);
      oup_00 = (fft_data *)malloc(sVar24);
      oup_01 = (fft_data *)malloc(sVar24);
      pvVar12 = malloc(lVar18 * 4);
      lVar11 = 0;
      uVar19 = 0;
      if (0 < (int)uVar25) {
        uVar19 = (ulong)uVar25;
      }
      for (; uVar19 * 8 != lVar11; lVar11 = lVar11 + 8) {
        *(double *)((long)&inp_00->re + lVar11 * 2) =
             *(double *)((long)wt->wave->lpd + lVar11) / 1.4142135623730951;
        *(undefined8 *)((long)&inp_00->im + lVar11 * 2) = 0;
      }
      pfVar13 = inp_00 + lVar9;
      for (lVar11 = lVar9; lVar11 < lVar18; lVar11 = lVar11 + 1) {
        pfVar13->re = 0.0;
        pfVar13->im = 0.0;
        pfVar13 = pfVar13 + 1;
      }
      fft_exec(obj,inp_00,oup_00);
      for (lVar11 = 0; uVar19 * 8 != lVar11; lVar11 = lVar11 + 8) {
        *(double *)((long)&inp_00->re + lVar11 * 2) =
             *(double *)((long)wt->wave->hpd + lVar11) / 1.4142135623730951;
        *(undefined8 *)((long)&inp_00->im + lVar11 * 2) = 0;
      }
      pfVar13 = inp_00 + lVar9;
      for (; lVar9 < lVar18; lVar9 = lVar9 + 1) {
        pfVar13->re = 0.0;
        pfVar13->im = 0.0;
        pfVar13 = pfVar13 + 1;
      }
      fft_exec(obj,inp_00,oup_01);
      lVar9 = 0;
      uVar19 = 0;
      if (0 < (int)uVar5) {
        uVar19 = (ulong)uVar5;
      }
      for (; uVar19 * 8 != lVar9; lVar9 = lVar9 + 8) {
        *(undefined8 *)((long)&inp_00->re + lVar9 * 2) = *(undefined8 *)((long)inp + lVar9);
        *(undefined8 *)((long)&inp_00->im + lVar9 * 2) = 0;
      }
      pdVar10 = &inp_00[lVar23].im;
      iVar15 = ~uVar5 + uVar21;
      for (; lVar23 < lVar18; lVar23 = lVar23 + 1) {
        ((fft_data *)(pdVar10 + -1))->re = inp[iVar15];
        *pdVar10 = 0.0;
        pdVar10 = pdVar10 + 2;
        iVar15 = iVar15 + -1;
      }
      fft_exec(obj,inp_00,oup);
      local_40 = wt->outlength;
      iVar15 = 0;
      uVar19 = 0;
      if (0 < (int)uVar21) {
        uVar19 = (ulong)uVar21;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      iVar8 = 1;
      for (; iVar15 != iVar7; iVar15 = iVar15 + 1) {
        lVar9 = (long)local_40;
        iVar16 = 0;
        for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
          *(int *)((long)pvVar12 + uVar20 * 4) = iVar16 % (int)uVar21;
          iVar16 = iVar16 + iVar8;
        }
        for (lVar23 = 0; uVar19 * 4 - lVar23 != 0; lVar23 = lVar23 + 4) {
          dVar27 = *(double *)((long)&oup->re + lVar23 * 4);
          dVar28 = *(double *)((long)&oup->im + lVar23 * 4);
          iVar16 = *(int *)((long)pvVar12 + lVar23);
          dVar2 = oup_00[iVar16].re;
          dVar3 = oup_00[iVar16].im;
          dVar4 = oup_01[iVar16].re;
          *(double *)((long)&oup->re + lVar23 * 4) = dVar2 * dVar27 - dVar28 * dVar3;
          *(double *)((long)&oup->im + lVar23 * 4) = dVar2 * dVar28 + dVar3 * dVar27;
          dVar2 = oup_01[iVar16].im;
          *(double *)((long)&inp_01->re + lVar23 * 4) = dVar4 * dVar27 - dVar28 * dVar2;
          *(double *)((long)&inp_01->im + lVar23 * 4) = dVar4 * dVar28 + dVar27 * dVar2;
        }
        local_40 = local_40 - uVar21;
        fft_exec(obj_00,inp_01,inp_00);
        for (lVar23 = 0; uVar19 * 8 - lVar23 != 0; lVar23 = lVar23 + 8) {
          *(double *)((long)wt + lVar23 + lVar9 * 8 + lVar18 * -8 + 0x1f8) =
               *(double *)((long)&inp_00->re + lVar23 * 2) / (double)(int)uVar21;
        }
        iVar8 = iVar8 * 2;
      }
      fft_exec(obj_00,oup,inp_00);
      for (lVar9 = 0; uVar19 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
        *(double *)(wt[1].method + lVar9 + -0x10) =
             *(double *)((long)&inp_00->re + lVar9 * 2) / (double)(int)uVar21;
      }
      free(inp_00);
      free(oup);
      free(inp_01);
      free(oup_00);
      free(oup_01);
      free_fft(obj);
      free_fft(obj_00);
      return;
    }
    __s = "Error- Available Choices for this method are - direct and fft ";
  }
  puts(__s);
  exit(-1);
}

Assistant:

void modwt(wt_object wt, const double *inp) {
	if (!strcmp(wt->cmethod, "direct")) {
		modwt_direct(wt, inp);
	}
	else if (!strcmp(wt->cmethod, "fft")) {
		modwt_fft(wt, inp);
	}
	else {
		printf("Error- Available Choices for this method are - direct and fft \n");
		exit(-1);
	}
}